

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O3

void __thiscall rsg::BlockStatement::~BlockStatement(BlockStatement *this)

{
  pointer ppSVar1;
  pointer ppSVar2;
  
  (this->super_Statement)._vptr_Statement = (_func_int **)&PTR__BlockStatement_0217f0d0;
  ppSVar2 = (this->m_children).
            super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppSVar1 = (this->m_children).
            super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppSVar2 != ppSVar1) {
    do {
      if (*ppSVar2 != (Statement *)0x0) {
        (*(*ppSVar2)->_vptr_Statement[1])();
        ppSVar1 = (this->m_children).
                  super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      ppSVar2 = ppSVar2 + 1;
    } while (ppSVar2 != ppSVar1);
    ppSVar2 = (this->m_children).
              super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppSVar1 != ppSVar2) {
      (this->m_children).super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppSVar2;
    }
  }
  if (ppSVar2 != (pointer)0x0) {
    operator_delete(ppSVar2,(long)(this->m_children).
                                  super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar2
                   );
  }
  VariableScope::~VariableScope(&this->m_scope);
  return;
}

Assistant:

BlockStatement::~BlockStatement (void)
{
	for (vector<Statement*>::iterator i = m_children.begin(); i != m_children.end(); i++)
		delete *i;
	m_children.clear();
}